

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformationImplementation::GetProgramStack_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,int firstFrame,
          int wholePath)

{
  size_type sVar1;
  int iVar2;
  ostream *poVar3;
  ssize_t sVar4;
  undefined4 in_register_0000000c;
  char *__buf;
  int iVar5;
  long lVar6;
  _Alloc_hider __s;
  string binary;
  SymbolProperties symProps;
  ostringstream oss;
  Dl_info info;
  void *stackSymbols [256];
  string local_ea8;
  int local_e84;
  SymbolProperties local_e80;
  long *local_e00;
  long local_df8;
  long local_df0 [2];
  string local_de0;
  ulong local_dc0;
  undefined1 *local_db8;
  long local_db0 [3];
  uint auStack_d98 [22];
  ios_base local_d40 [264];
  string local_c38 [32];
  undefined1 local_838 [2056];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_e84 = firstFrame;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "WARNING: The stack trace will not use advanced capabilities because this is a release build.\n"
             ,"",CONCAT44(in_register_0000000c,wholePath));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_db0);
  iVar2 = backtrace(local_838);
  iVar5 = (int)this;
  if (iVar2 - iVar5 != 0 && iVar5 <= iVar2) {
    local_db8 = local_838 + (long)iVar5 * 8;
    lVar6 = 0;
    local_dc0 = (ulong)(uint)(iVar2 - iVar5);
    do {
      local_e80.Binary._M_dataplus._M_p = (pointer)&local_e80.Binary.field_2;
      local_e80.Binary._M_string_length = 0;
      local_e80.Binary.field_2._M_local_buf[0] = '\0';
      local_e80.SourceFile._M_dataplus._M_p = (pointer)&local_e80.SourceFile.field_2;
      local_e80.SourceFile._M_string_length = 0;
      local_e80.SourceFile.field_2._M_local_buf[0] = '\0';
      local_e80.Function._M_dataplus._M_p = (pointer)&local_e80.Function.field_2;
      local_e80.Function._M_string_length = 0;
      local_e80.Function.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)&local_e80,0,(char *)0x0,0x50ca94);
      local_e80.BinaryBaseAddress = (void *)0x0;
      local_e80.Address = (void *)0x0;
      std::__cxx11::string::_M_replace
                ((ulong)&local_e80.SourceFile,0,(char *)local_e80.SourceFile._M_string_length,
                 0x50ca94);
      anon_unknown_3::SymbolProperties::SetFunction(&local_e80,"???");
      local_e80.LineNumber = -1;
      local_e80.ReportPath = 0;
      local_c38[0]._M_dataplus._M_p = (pointer)&local_c38[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c38,local_e80.Function._M_dataplus._M_p,
                 local_e80.Function._M_dataplus._M_p + local_e80.Function._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c38[0]._M_dataplus._M_p != &local_c38[0].field_2) {
        operator_delete(local_c38[0]._M_dataplus._M_p,
                        (ulong)(local_c38[0].field_2._M_allocated_capacity + 1));
      }
      anon_unknown_3::SymbolProperties::GetFileName(&local_ea8,&local_e80,&local_e80.SourceFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
        operator_delete(local_ea8._M_dataplus._M_p,
                        CONCAT71(local_ea8.field_2._M_allocated_capacity._1_7_,
                                 local_ea8.field_2._M_local_buf[0]) + 1);
      }
      local_e80.ReportPath = local_e84;
      local_e80.Address = *(void **)(local_db8 + lVar6 * 8);
      iVar2 = dladdr();
      sVar1 = local_e80.Binary._M_string_length;
      if (((iVar2 != 0) && ((char *)local_c38[0].field_2._0_8_ != (char *)0x0)) &&
         (local_c38[0].field_2._8_8_ != 0)) {
        __s._M_p = local_c38[0]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c38[0]._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          __s._M_p = "???";
        }
        strlen(__s._M_p);
        std::__cxx11::string::_M_replace((ulong)&local_e80,0,(char *)sVar1,(ulong)__s._M_p);
        anon_unknown_3::SymbolProperties::SetFunction(&local_e80,(char *)local_c38[0].field_2._0_8_)
        ;
      }
      *(uint *)((long)auStack_d98 + *(long *)(local_db0[0] + -0x18)) =
           *(uint *)((long)auStack_d98 + *(long *)(local_db0[0] + -0x18)) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<void_const*>(local_db0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," : ",3);
      local_e00 = local_df0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e00,local_e80.Function._M_dataplus._M_p,
                 local_e80.Function._M_dataplus._M_p + local_e80.Function._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_e00,local_df8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [(",3);
      iVar2 = std::__cxx11::string::compare((char *)&local_e80);
      if (iVar2 == 0) {
        local_ea8._M_dataplus._M_p = (pointer)&local_ea8.field_2;
        local_ea8._M_string_length = 0;
        local_ea8.field_2._M_local_buf[0] = '\0';
        __buf = (char *)local_c38;
        memset(__buf,0,0x400);
        sVar4 = readlink("/proc/self/exe",__buf,0x400);
        sVar1 = local_ea8._M_string_length;
        if (sVar4 < 1) {
          __buf = "/proc/self/exe";
        }
        else {
          *(undefined1 *)((long)&local_c38[0]._M_dataplus._M_p + sVar4) = 0;
          strlen(__buf);
        }
        std::__cxx11::string::_M_replace((ulong)&local_ea8,0,(char *)sVar1,(ulong)__buf);
        anon_unknown_3::SymbolProperties::GetFileName(&local_de0,&local_e80,&local_ea8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
          operator_delete(local_ea8._M_dataplus._M_p,
                          CONCAT71(local_ea8.field_2._M_allocated_capacity._1_7_,
                                   local_ea8.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        anon_unknown_3::SymbolProperties::GetFileName(&local_de0,&local_e80,&local_e80.Binary);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_de0._M_dataplus._M_p,local_de0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      anon_unknown_3::SymbolProperties::GetFileName(local_c38,&local_e80,&local_e80.SourceFile);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_c38[0]._M_dataplus._M_p,local_c38[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c38[0]._M_dataplus._M_p != &local_c38[0].field_2) {
        operator_delete(local_c38[0]._M_dataplus._M_p,
                        (ulong)(local_c38[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_de0._M_dataplus._M_p != &local_de0.field_2) {
        operator_delete(local_de0._M_dataplus._M_p,local_de0.field_2._M_allocated_capacity + 1);
      }
      if (local_e00 != local_df0) {
        operator_delete(local_e00,local_df0[0] + 1);
      }
      std::ios::widen((char)*(undefined8 *)(local_db0[0] + -0x18) + (char)local_db0);
      std::ostream::put((char)local_db0);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e80.Function._M_dataplus._M_p != &local_e80.Function.field_2) {
        operator_delete(local_e80.Function._M_dataplus._M_p,
                        CONCAT71(local_e80.Function.field_2._M_allocated_capacity._1_7_,
                                 local_e80.Function.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e80.SourceFile._M_dataplus._M_p != &local_e80.SourceFile.field_2) {
        operator_delete(local_e80.SourceFile._M_dataplus._M_p,
                        CONCAT71(local_e80.SourceFile.field_2._M_allocated_capacity._1_7_,
                                 local_e80.SourceFile.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e80.Binary._M_dataplus._M_p != &local_e80.Binary.field_2) {
        operator_delete(local_e80.Binary._M_dataplus._M_p,
                        CONCAT71(local_e80.Binary.field_2._M_allocated_capacity._1_7_,
                                 local_e80.Binary.field_2._M_local_buf[0]) + 1);
      }
      lVar6 = lVar6 + 1;
    } while ((int)local_dc0 != (int)lVar6);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)local_c38[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38[0]._M_dataplus._M_p != &local_c38[0].field_2) {
    operator_delete(local_c38[0]._M_dataplus._M_p,
                    (ulong)(local_c38[0].field_2._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_db0);
  std::ios_base::~ios_base(local_d40);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemInformationImplementation::GetProgramStack(
      int firstFrame,
      int wholePath)
{
  kwsys_stl::string programStack = ""
#if !defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
    "WARNING: The stack could not be examined "
    "because backtrace is not supported.\n"
#elif !defined(KWSYS_SYSTEMINFORMATION_HAS_DEBUG_BUILD)
    "WARNING: The stack trace will not use advanced "
    "capabilities because this is a release build.\n"
#else
# if !defined(KWSYS_SYSTEMINFORMATION_HAS_SYMBOL_LOOKUP)
    "WARNING: Function names will not be demangled because "
    "dladdr is not available.\n"
# endif
# if !defined(KWSYS_SYSTEMINFORMATION_HAS_CPP_DEMANGLE)
    "WARNING: Function names will not be demangled "
    "because cxxabi is not available.\n"
# endif
#endif
    ;

  kwsys_ios::ostringstream oss;
#if defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
  void *stackSymbols[256];
  int nFrames=backtrace(stackSymbols,256);
  for (int i=firstFrame; i<nFrames; ++i)
    {
    SymbolProperties symProps;
    symProps.SetReportPath(wholePath);
    symProps.Initialize(stackSymbols[i]);
    oss << symProps << kwsys_ios::endl;
    }
#else
  (void)firstFrame;
  (void)wholePath;
#endif
  programStack += oss.str();

  return programStack;
}